

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HumanPlayerStrategy.cpp
# Opt level: O2

void __thiscall HumanPlayerStrategy::execute(HumanPlayerStrategy *this,Game *game,Player *player)

{
  bool bVar1;
  int iVar2;
  Map *pMVar3;
  string *psVar4;
  ostream *poVar5;
  string choice;
  string local_48;
  
  Player::rollDice(player);
  Game::resolvePlayer(game,player,true);
  iVar2 = Player::getLifePoints(player);
  if (iVar2 < 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Player : ");
    psVar4 = Player::getPlayerName_abi_cxx11_(player);
    poVar5 = std::operator<<(poVar5,(string *)psVar4);
    poVar5 = std::operator<<(poVar5," died while resolving dice");
    std::endl<char,std::char_traits<char>>(poVar5);
    return;
  }
  iVar2 = Player::getZone(player);
  if (0 < iVar2) {
    iVar2 = Player::getZone(player);
    if (iVar2 < 7) {
      Player::setPhase(player,Move);
      choice._M_dataplus._M_p = (pointer)&choice.field_2;
      choice._M_string_length = 0;
      choice.field_2._M_local_buf[0] = '\0';
      iVar2 = Player::getZone(player);
      if (iVar2 == 1) {
        iVar2 = 2;
        Player::setZone(player,2);
        pMVar3 = Game::getGameMap(game);
        Map::removeRegionOwner(pMVar3,player);
        pMVar3 = Game::getGameMap(game);
      }
      else {
        iVar2 = Player::getZone(player);
        if (iVar2 == 2) {
          iVar2 = 3;
          Player::setZone(player,3);
          pMVar3 = Game::getGameMap(game);
          Map::removeRegionOwner(pMVar3,player);
          pMVar3 = Game::getGameMap(game);
        }
        else {
          iVar2 = Player::getZone(player);
          if (iVar2 == 3) {
            poVar5 = std::operator<<((ostream *)&std::cout,
                                     "You are in Upper Manhattan. Do you wish to stay? (Y | N) ");
            std::endl<char,std::char_traits<char>>(poVar5);
            std::operator>>((istream *)&std::cin,(string *)&choice);
LAB_0011411f:
            bVar1 = std::operator==(&choice,"N");
            if (bVar1) {
              pMVar3 = Game::getGameMap(game);
              Map::removeRegionOwner(pMVar3,player);
              pMVar3 = Game::getGameMap(game);
              Map::move(pMVar3,player);
            }
            goto LAB_001140c8;
          }
          iVar2 = Player::getZone(player);
          if (iVar2 == 4) {
            iVar2 = 5;
            Player::setZone(player,5);
            pMVar3 = Game::getGameMap(game);
            Map::removeRegionOwner(pMVar3,player);
            pMVar3 = Game::getGameMap(game);
          }
          else {
            iVar2 = Player::getZone(player);
            if (iVar2 != 5) {
              iVar2 = Player::getZone(player);
              if (iVar2 != 6) goto LAB_001140c8;
              poVar5 = std::operator<<((ostream *)&std::cout,
                                       "You are in Upper Manhattan. Do you wish to stay? (Y | N) ");
              std::endl<char,std::char_traits<char>>(poVar5);
              std::operator>>((istream *)&std::cin,(string *)&choice);
              goto LAB_0011411f;
            }
            iVar2 = 6;
            Player::setZone(player,6);
            pMVar3 = Game::getGameMap(game);
            Map::removeRegionOwner(pMVar3,player);
            pMVar3 = Game::getGameMap(game);
          }
        }
      }
      Map::setRegionOwner(pMVar3,iVar2,player);
      goto LAB_001140c8;
    }
  }
  pMVar3 = Game::getGameMap(game);
  bVar1 = Map::isManhattanEmpty(pMVar3);
  if (bVar1) {
    Player::setPhase(player,Move);
    iVar2 = Game::getNumberOfPlayers(game);
    if (iVar2 < 5) {
      Player::setZone(player,1);
      pMVar3 = Game::getGameMap(game);
      Map::removeRegionOwner(pMVar3,player);
      pMVar3 = Game::getGameMap(game);
      Map::setRegionOwner(pMVar3,1,player);
      poVar5 = std::operator<<((ostream *)&std::cout,"Player : ");
      psVar4 = Player::getPlayerName_abi_cxx11_(player);
      poVar5 = std::operator<<(poVar5,(string *)psVar4);
      poVar5 = std::operator<<(poVar5," is in : ");
      Player::getZoneName_abi_cxx11_(&choice,player);
      poVar5 = std::operator<<(poVar5,(string *)&choice);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      Player::setZone(player,4);
      pMVar3 = Game::getGameMap(game);
      Map::removeRegionOwner(pMVar3,player);
      pMVar3 = Game::getGameMap(game);
      Map::setRegionOwner(pMVar3,4,player);
      poVar5 = std::operator<<((ostream *)&std::cout,"Player : ");
      psVar4 = Player::getPlayerName_abi_cxx11_(player);
      poVar5 = std::operator<<(poVar5,(string *)psVar4);
      poVar5 = std::operator<<(poVar5," is in : ");
      Player::getZoneName_abi_cxx11_(&choice,player);
      poVar5 = std::operator<<(poVar5,(string *)&choice);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
  }
  else {
    choice._M_dataplus._M_p = (pointer)&choice.field_2;
    choice._M_string_length = 0;
    choice.field_2._M_local_buf[0] = '\0';
    poVar5 = std::operator<<((ostream *)&std::cout,"There is another player in Manhattan");
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "Do you want to move (M) or stay (S) in current location : ");
    Player::getZoneName_abi_cxx11_(&local_48,player);
    poVar5 = std::operator<<(poVar5,(string *)&local_48);
    poVar5 = std::operator<<(poVar5,"?");
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string((string *)&local_48);
    std::operator>>((istream *)&std::cin,(string *)&choice);
    bVar1 = std::operator==(&choice,"M");
    if (bVar1) {
      pMVar3 = Game::getGameMap(game);
      Map::removeRegionOwner(pMVar3,player);
      pMVar3 = Game::getGameMap(game);
      Map::move(pMVar3,player);
    }
  }
LAB_001140c8:
  std::__cxx11::string::~string((string *)&choice);
  Game::buyCards(game,player);
  return;
}

Assistant:

void HumanPlayerStrategy::execute(Game *game, Player *player)
{

    player->rollDice();
    // resolve the dice (mandatory) ordered
    game->resolvePlayer(player, true);

    if(player->getLifePoints() <= 0) {
        cout << "Player : " << player->getPlayerName() << " died while resolving dice" << endl;
        return;
    }
    // move

    // if player is in manhattan
    if(player->getZone()>0 && player->getZone()<7){
        player->setPhase(Player::Phase::Move);
        std::string choice;
        if(player->getZone() == 1) {  // Manhattan Lower 2-4
            player->setZone(2);
            game->getGameMap()->removeRegionOwner(player);
            game->getGameMap()->setRegionOwner(2, player);
        }
        else if(player->getZone() == 2) {  // Manhattan Midtown 2-4
            player->setZone(3);
            game->getGameMap()->removeRegionOwner(player);
            game->getGameMap()->setRegionOwner(3, player);
        }
        else if(player->getZone() == 3) {  // Manhattan Upper 2-4
            cout << "You are in Upper Manhattan. Do you wish to stay? (Y | N) " << endl;
            cin >> choice;
            if (choice == "N"){
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->move(player);
            }
        }
        else if(player->getZone() == 4) {  // Manhattan Lower 5-6
            player->setZone(5);
            game->getGameMap()->removeRegionOwner(player);
            game->getGameMap()->setRegionOwner(5, player);
        }
        else if(player->getZone() == 5) {  // Manhattan Midtown 5-6
            player->setZone(6);
            game->getGameMap()->removeRegionOwner(player);
            game->getGameMap()->setRegionOwner(6, player);
        }
        else if(player->getZone() == 6) {  // Manhattan Upper 5-6
            cout << "You are in Upper Manhattan. Do you wish to stay? (Y | N) " << endl;
            cin >> choice;
            if (choice == "N"){
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->move(player);
            }
        }


    }
    else { // Not in manhattan
        if(game->getGameMap()->isManhattanEmpty()){ // must move to manhattan if empty
            player->setPhase(Player::Phase::Move);
            if (game->getNumberOfPlayers() < 5){
                player->setZone(1);
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->setRegionOwner(1, player);
                cout << "Player : " << player->getPlayerName() << " is in : " << player->getZoneName() << endl;
            }
            else{
                player->setZone(4);
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->setRegionOwner(4, player);
                cout << "Player : " << player->getPlayerName() << " is in : " << player->getZoneName() << endl;
            }
        }
        else{ // there is atleast 1 player in manhattan
            std::string choice;
            cout << "There is another player in Manhattan" << endl;
            cout << "Do you want to move (M) or stay (S) in current location : " << player->getZoneName() << "?" << endl;
            cin >> choice;
            if (choice == "M"){
                game->getGameMap()->removeRegionOwner(player);
                game->getGameMap()->move(player);
            }

        }

    }

    // buy cards (optional)
    game->buyCards(player);
}